

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O0

void __thiscall
kratos::UniqueGeneratorVisitor::visit(UniqueGeneratorVisitor *this,Generator *generator)

{
  bool bVar1;
  _Self local_28;
  _Self local_20;
  Generator *local_18;
  Generator *generator_local;
  UniqueGeneratorVisitor *this_local;
  
  local_18 = generator;
  generator_local = (Generator *)this;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_>_>
       ::find(&this->generator_map_,&generator->name);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_>_>
       ::end(&this->generator_map_);
  bVar1 = std::operator!=(&local_20,&local_28);
  if ((!bVar1) && (bVar1 = Generator::external(local_18), !bVar1)) {
    std::
    map<std::__cxx11::string,kratos::Generator*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,kratos::Generator*>>>
    ::emplace<std::__cxx11::string&,kratos::Generator*&>
              ((map<std::__cxx11::string,kratos::Generator*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,kratos::Generator*>>>
                *)&this->generator_map_,&local_18->name,&local_18);
  }
  return;
}

Assistant:

void visit(Generator* generator) override {
        if (generator_map_.find(generator->name) != generator_map_.end()) {
            return;
        }
        // a unique one
        if (!generator->external()) generator_map_.emplace(generator->name, generator);
    }